

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void UpdateWindowInFocusOrderList(ImGuiWindow *window,bool just_created,ImGuiWindowFlags new_flags)

{
  ImVector<ImGuiWindow_*> *this;
  short *psVar1;
  int iVar2;
  ImGuiWindow **ppIVar3;
  ImGuiContext *pIVar4;
  long lVar5;
  uint uVar6;
  bool bVar7;
  ImGuiWindow *local_20;
  
  pIVar4 = GImGui;
  uVar6 = new_flags & 0x1000000;
  bVar7 = SUB41(uVar6 >> 0x18,0);
  local_20 = window;
  if ((~just_created & uVar6 >> 0x18 == (uint)window->IsExplicitChild) == 0 && bVar7 == false) {
    ImVector<ImGuiWindow_*>::push_back(&GImGui->WindowsFocusOrder,&local_20);
    local_20->FocusOrder = (short)(pIVar4->WindowsFocusOrder).Size + -1;
    window = local_20;
  }
  else if ((uVar6 != 0 && !just_created) && uVar6 >> 0x18 != (uint)window->IsExplicitChild) {
    lVar5 = (long)window->FocusOrder;
    this = &GImGui->WindowsFocusOrder;
    iVar2 = (GImGui->WindowsFocusOrder).Size;
    ppIVar3 = (GImGui->WindowsFocusOrder).Data;
    while (lVar5 = lVar5 + 1, lVar5 < iVar2) {
      psVar1 = &ppIVar3[lVar5]->FocusOrder;
      *psVar1 = *psVar1 + -1;
    }
    ImVector<ImGuiWindow_*>::erase(this,ppIVar3 + window->FocusOrder);
    window->FocusOrder = -1;
  }
  window->IsExplicitChild = bVar7;
  return;
}

Assistant:

static void UpdateWindowInFocusOrderList(ImGuiWindow* window, bool just_created, ImGuiWindowFlags new_flags)
{
    ImGuiContext& g = *GImGui;

    const bool new_is_explicit_child = (new_flags & ImGuiWindowFlags_ChildWindow) != 0;
    const bool child_flag_changed = new_is_explicit_child != window->IsExplicitChild;
    if ((just_created || child_flag_changed) && !new_is_explicit_child)
    {
        IM_ASSERT(!g.WindowsFocusOrder.contains(window));
        g.WindowsFocusOrder.push_back(window);
        window->FocusOrder = (short)(g.WindowsFocusOrder.Size - 1);
    }
    else if (!just_created && child_flag_changed && new_is_explicit_child)
    {
        IM_ASSERT(g.WindowsFocusOrder[window->FocusOrder] == window);
        for (int n = window->FocusOrder + 1; n < g.WindowsFocusOrder.Size; n++)
            g.WindowsFocusOrder[n]->FocusOrder--;
        g.WindowsFocusOrder.erase(g.WindowsFocusOrder.Data + window->FocusOrder);
        window->FocusOrder = -1;
    }
    window->IsExplicitChild = new_is_explicit_child;
}